

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

_Bool askfor_aux_keypress(char *buf,size_t buflen,size_t *curs,size_t *len,keypress keypress,
                         _Bool firsttime)

{
  ulong n;
  size_t sVar1;
  keycode_t kc;
  _Bool _Var2;
  size_t sVar3;
  size_t __n;
  char *__dest;
  char *__src;
  size_t sVar4;
  char *pcVar5;
  char encoded [5];
  undefined8 local_40;
  uint8_t local_38;
  
  local_40 = keypress._0_8_;
  local_38 = keypress.mods;
  sVar3 = utf8_strlen(buf);
  kc = keypress.code;
  if (kc - 0x9e < 2) {
    if (firsttime) {
      *buf = '\0';
      *curs = 0;
      *len = 0;
      return false;
    }
    n = *curs;
    if (kc == 0x9f) {
      if (n == 0) {
        return false;
      }
    }
    else if (sVar3 <= n) {
      return false;
    }
    pcVar5 = utf8_fskip(buf,n,(char *)0x0);
    if (pcVar5 != (char *)0x0) {
      if (kc == 0x9f) {
        __dest = utf8_rskip(pcVar5,1,buf);
        if (__dest == (char *)0x0) {
          __assert_fail("oshift",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                        ,0x2d6,
                        "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                       );
        }
        memmove(__dest,pcVar5,(size_t)(buf + (*len - (long)pcVar5)));
        *curs = *curs - 1;
        __src = pcVar5;
      }
      else {
        __src = utf8_fskip(buf + *curs,1,(char *)0x0);
        if (__src == (char *)0x0) {
          __assert_fail("oshift",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                        ,0x2de,
                        "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                       );
        }
        memmove(pcVar5,__src,(size_t)(buf + (*len - (long)__src)));
        __dest = pcVar5;
      }
      sVar3 = *len;
      *len = (size_t)(__dest + (sVar3 - (long)__src));
      buf[(long)(__dest + (sVar3 - (long)__src))] = '\0';
      return false;
    }
    __assert_fail("ocurs",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                  ,0x2d2,
                  "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                 );
  }
  if (kc == 0x81) {
    if (firsttime) {
      *curs = 0;
      return false;
    }
    if (*curs == 0) {
      return false;
    }
    sVar3 = *curs - 1;
LAB_001c47b2:
    *curs = sVar3;
    return false;
  }
  if (kc == 0x82) {
    if (firsttime) {
      *curs = sVar3;
      return false;
    }
    if (sVar3 <= *curs) {
      return false;
    }
    sVar3 = *curs + 1;
    goto LAB_001c47b2;
  }
  if (kc == 0x9c) {
    *curs = sVar3;
    return true;
  }
  if (kc == 0xe000) {
    *curs = 0;
    return true;
  }
  sVar1 = *curs;
  _Var2 = keycode_isprint(kc);
  if ((!_Var2) ||
     (__n = utf32_to_utf8(encoded,5,(uint32_t *)((long)&local_40 + 4),1,(size_t *)0x0), __n == 0)) {
    bell();
    return false;
  }
  if (firsttime) {
    *buf = '\0';
    *curs = 0;
    *len = 0;
    if (buflen <= __n) {
      return false;
    }
    sVar4 = 0;
  }
  else {
    sVar4 = *len;
    if (buflen <= sVar4 + __n) {
      return false;
    }
    if (sVar1 != sVar3) {
      pcVar5 = utf8_fskip(buf,*curs,(char *)0x0);
      if (pcVar5 == (char *)0x0) {
        __assert_fail("ocurs",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                      ,0x30d,
                      "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                     );
      }
      memmove(pcVar5 + __n,pcVar5,(size_t)(buf + (*len - (long)pcVar5)));
      goto LAB_001c4845;
    }
  }
  pcVar5 = buf + sVar4;
LAB_001c4845:
  memcpy(pcVar5,encoded,__n);
  *curs = *curs + 1;
  sVar3 = *len;
  *len = __n + sVar3;
  buf[__n + sVar3] = '\0';
  return false;
}

Assistant:

bool askfor_aux_keypress(char *buf, size_t buflen, size_t *curs, size_t *len,
						 struct keypress keypress, bool firsttime)
{
	size_t ulen = utf8_strlen(buf);

	switch (keypress.code)
	{
		case ESCAPE:
		{
			*curs = 0;
			return true;
		}
		
		case KC_ENTER:
		{
			*curs = ulen;
			return true;
		}
		
		case ARROW_LEFT:
		{
			if (firsttime) {
				*curs = 0;
			} else if (*curs > 0) {
				(*curs)--;
			}
			break;
		}
		
		case ARROW_RIGHT:
		{
			if (firsttime) {
				*curs = ulen;
			} else if (*curs < ulen) {
				(*curs)++;
			}
			break;
		}
		
		case KC_BACKSPACE:
		case KC_DELETE:
		{
			char *ocurs, *oshift;

			/* If this is the first time round, backspace means "delete all" */
			if (firsttime) {
				buf[0] = '\0';
				*curs = 0;
				*len = 0;
				break;
			}

			/* Refuse to backspace into oblivion */
			if ((keypress.code == KC_BACKSPACE && *curs == 0) ||
				(keypress.code == KC_DELETE && *curs >= ulen))
				break;

			/*
			 * Move the string from k to nul along to the left
			 * by 1.  First, have to get offset corresponding to
			 * the cursor position.
			 */
			ocurs = utf8_fskip(buf, *curs, NULL);
			assert(ocurs);
			if (keypress.code == KC_BACKSPACE) {
				/* Get offset of the previous character. */
				oshift = utf8_rskip(ocurs, 1, buf);
				assert(oshift);
				memmove(oshift, ocurs, *len - (ocurs - buf));
				/* Decrement. */
				(*curs)--;
				*len -= ocurs - oshift;
			} else {
				/* Get offset of the next character. */
				oshift = utf8_fskip(buf + *curs, 1, NULL);
				assert(oshift);
				memmove(ocurs, oshift, *len - (oshift - buf));
				/* Decrement */
				*len -= oshift - ocurs;
			}

			/* Terminate */
			buf[*len] = '\0';

			break;
		}
		
		default:
		{
			bool atnull = (*curs == ulen);
			char encoded[5];
			size_t n_enc = 0;
			char *ocurs;

			if (keycode_isprint(keypress.code)) {
				n_enc = utf32_to_utf8(encoded,
					N_ELEMENTS(encoded), &keypress.code,
					1, NULL);
			}
			if (n_enc == 0) {
				bell();
				break;
			}

			/* Clear the buffer if this is the first time round */
			if (firsttime) {
				buf[0] = '\0';
				*curs = 0;
				*len = 0;
				atnull = 1;
			}

			/* Make sure we have enough room for the new character */
			if (*len + n_enc >= buflen) {
				break;
			}

			/* Insert the encoded character. */
			if (atnull) {
				ocurs = buf + *len;
			} else {
				ocurs = utf8_fskip(buf, *curs, NULL);
				assert(ocurs);
				/*
				 * Move the rest of the buffer along to make
				 * room.
				 */
				memmove(ocurs + n_enc, ocurs,
					*len - (ocurs - buf));
			}
			memcpy(ocurs, encoded, n_enc);

			/* Update position and length. */
			(*curs)++;
			*len += n_enc;

			/* Terminate */
			buf[*len] = '\0';

			break;
		}
	}

	/* By default, we aren't done. */
	return false;
}